

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int array_container_shrink_to_fit(array_container_t *src)

{
  int iVar1;
  uint16_t *puVar2;
  int iVar3;
  uint16_t *puVar4;
  int iVar5;
  uint16_t *oldarray;
  
  iVar1 = src->cardinality;
  iVar5 = src->capacity - iVar1;
  iVar3 = 0;
  if (iVar5 != 0) {
    src->capacity = iVar1;
    puVar2 = src->array;
    iVar3 = iVar5;
    if (iVar1 == 0) {
      (*global_memory_hook.free)(puVar2);
      src->array = (uint16_t *)0x0;
    }
    else {
      puVar4 = (uint16_t *)(*global_memory_hook.realloc)(puVar2,(long)iVar1 * 2);
      src->array = puVar4;
      if (puVar4 == (uint16_t *)0x0) {
        (*global_memory_hook.free)(puVar2);
      }
    }
  }
  return iVar3;
}

Assistant:

int array_container_shrink_to_fit(array_container_t *src) {
    if (src->cardinality == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->cardinality;
    src->capacity = src->cardinality;
    if (src->capacity ==
        0) {  // we do not want to rely on realloc for zero allocs
        roaring_free(src->array);
        src->array = NULL;
    } else {
        uint16_t *oldarray = src->array;
        src->array = (uint16_t *)roaring_realloc(
            oldarray, src->capacity * sizeof(uint16_t));
        if (src->array == NULL) roaring_free(oldarray);  // should never happen?
    }
    return savings;
}